

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ModportClockingPortSyntax *pMVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModportClockingPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModportClockingPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModportClockingPortSyntax>(
        *deepClone(node.attributes, alloc),
        node.clocking.deepClone(alloc),
        node.name.deepClone(alloc)
    );
}